

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
Parser_unitsWithCellMLRealVariations_Test::Parser_unitsWithCellMLRealVariations_Test
          (Parser_unitsWithCellMLRealVariations_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_001552b0;
  return;
}

Assistant:

TEST(Parser, unitsWithCellMLRealVariations)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <units name=\"fahrenheitish\">\n"
        "    <unit multiplier=\"1.8\" exponent=\"-0.23E-13\" units=\"kelvin\"/>\n"
        "  </units>\n"
        "  <units name=\"units_invalid_reals\">\n"
        "    <unit multiplier=\"1.8.0\" exponent=\"4.87f87\" units=\"kelvin\"/>\n"
        "    <unit multiplier=\"+9.87\" exponent=\"4.87e+16\" units=\"oranges\"/>\n"
        "    <unit multiplier=\"AB8e34\" exponent=\"4.87ee32\" units=\"apples\"/>\n"
        "    <unit multiplier=\"AB8\" exponent=\"4.87eE32\" units=\"bananas\"/>\n"
        "    <unit multiplier=\"e7\" exponent=\"4.87e\" units=\"mangoes\"/>\n"
        "    <unit multiplier=\"3.4e7.8\" units=\"fruit\"/>\n"
        "    <unit exponent=\"\" units=\"strawberries\"/>\n"
        "  </units>\n"
        "</model>\n";

    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <units name=\"fahrenheitish\">\n"
        "    <unit exponent=\"-2.3e-14\" multiplier=\"1.8\" units=\"kelvin\"/>\n"
        "  </units>\n"
        "  <units name=\"units_invalid_reals\">\n"
        "    <unit units=\"kelvin\"/>\n"
        "    <unit exponent=\"4.87e+16\" units=\"oranges\"/>\n"
        "    <unit units=\"apples\"/>\n"
        "    <unit units=\"bananas\"/>\n"
        "    <unit units=\"mangoes\"/>\n"
        "    <unit units=\"fruit\"/>\n"
        "    <unit units=\"strawberries\"/>\n"
        "  </units>\n"
        "</model>\n";

    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(in);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(model);
    EXPECT_EQ(e, a);
}